

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O1

bool __thiscall
cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
          (cmGeneratorExpressionDAGChecker *this,cmGeneratorTarget *tgt,ForGenex genex)

{
  pointer __s1;
  size_t __n;
  int iVar1;
  size_type __rlen;
  char *__s2;
  cmGeneratorExpressionDAGChecker *pcVar2;
  bool bVar3;
  bool bVar4;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  do {
    pcVar2 = this;
    this = pcVar2->Parent;
  } while (pcVar2->Parent != (cmGeneratorExpressionDAGChecker *)0x0);
  __s1 = (pcVar2->Property)._M_dataplus._M_p;
  __n = (pcVar2->Property)._M_string_length;
  if (tgt == (cmGeneratorTarget *)0x0) {
    if ((((((__n == 0xe) && (iVar1 = bcmp(__s1,"LINK_LIBRARIES",0xe), iVar1 == 0)) ||
          ((__n == 0x18 && (iVar1 = bcmp(__s1,"INTERFACE_LINK_LIBRARIES",0x18), iVar1 == 0)))) ||
         ((__n == 0x1f && (iVar1 = bcmp(__s1,"INTERFACE_LINK_LIBRARIES_DIRECT",0x1f), iVar1 == 0))))
        || ((__n == 0x18 && (iVar1 = bcmp(__s1,"LINK_INTERFACE_LIBRARIES",0x18), iVar1 == 0)))) ||
       (((__n == 0x21 && (iVar1 = bcmp(__s1,"IMPORTED_LINK_INTERFACE_LIBRARIES",0x21), iVar1 == 0))
        || (__str._M_str = "LINK_INTERFACE_LIBRARIES_", __str._M_len = 0x19, local_28._M_len = __n,
           local_28._M_str = __s1,
           iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                             (&local_28,0,0x19,__str), iVar1 == 0)))) {
      bVar4 = true;
    }
    else {
      __str_00._M_str = "IMPORTED_LINK_INTERFACE_LIBRARIES_";
      __str_00._M_len = 0x22;
      local_28._M_len = __n;
      local_28._M_str = __s1;
      iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        (&local_28,0,0x22,__str_00);
      bVar4 = iVar1 == 0;
    }
    bVar3 = genex - LINK_LIBRARY < 2;
    if ((bool)(bVar3 | bVar4)) {
      return (bool)(bVar4 | !bVar3);
    }
    if (__n != 0x27) {
      return false;
    }
    __s2 = "INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE";
  }
  else {
    if (__n != 0xe || tgt != pcVar2->Target) {
      return false;
    }
    __s2 = "LINK_LIBRARIES";
  }
  iVar1 = bcmp(__s1,__s2,__n);
  return iVar1 == 0;
}

Assistant:

bool cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries(
  cmGeneratorTarget const* tgt, ForGenex genex) const
{
  const auto* top = this->Top();

  cm::string_view prop(top->Property);

  if (tgt) {
    return top->Target == tgt && prop == "LINK_LIBRARIES"_s;
  }

  auto result = prop == "LINK_LIBRARIES"_s ||
    prop == "INTERFACE_LINK_LIBRARIES"_s ||
    prop == "INTERFACE_LINK_LIBRARIES_DIRECT"_s ||
    prop == "LINK_INTERFACE_LIBRARIES"_s ||
    prop == "IMPORTED_LINK_INTERFACE_LIBRARIES"_s ||
    cmHasLiteralPrefix(prop, "LINK_INTERFACE_LIBRARIES_") ||
    cmHasLiteralPrefix(prop, "IMPORTED_LINK_INTERFACE_LIBRARIES_");

  return genex == ForGenex::LINK_LIBRARY || genex == ForGenex::LINK_GROUP
    ? result
    : (result || prop == "INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE"_s);
}